

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O1

void __thiscall
blockfilter_index_tests::blockfilter_index_init_destroy::test_method
          (blockfilter_index_init_destroy *this)

{
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_00;
  function<void_(BlockFilterIndex_&)> fn;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_01;
  readonly_property65 rVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  BlockFilterIndex *pBVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  int iter_count;
  undefined4 uVar7;
  undefined4 uVar8;
  BlockFilterType BVar9;
  check_type cVar12;
  char *pcVar10;
  _Manager_type in_stack_fffffffffffffc68;
  lazy_ostream *assertion_descr;
  _Invoker_type in_stack_fffffffffffffc70;
  _Invoker_type p_Var11;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  blockfilter_index_init_destroy *local_338;
  undefined8 uStack_330;
  code *local_328;
  code *pcStack_320;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined4 local_25c;
  undefined1 local_258 [16];
  undefined1 *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  int *local_218;
  undefined8 uStack_210;
  code *local_208;
  code *pcStack_200;
  int local_1ec;
  char *local_1e8;
  char *local_1e0;
  blockfilter_index_init_destroy *local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *pcStack_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  blockfilter_index_init_destroy *local_128;
  undefined8 uStack_120;
  code *local_118;
  code *pcStack_110;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined4 *local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  undefined4 **local_90;
  int *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x116;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "filter_index == nullptr";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_d8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)(pBVar4 == (BlockFilterIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_e0,0x116);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x118;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  uStack_120 = 0;
  pcStack_110 = std::
                _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
              ::_M_manager;
  make_chain.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  make_chain.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  make_chain._M_invoker = (_Invoker_type)in_stack_fffffffffffffc70;
  local_128 = this;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain,(BlockFilterType)&local_128,0,false,true);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_130 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_138,0x118);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,3);
  }
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11b;
  file_01.m_begin = (iterator)&local_148;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_158,
             msg_01);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "filter_index != nullptr";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_160 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)(pBVar4 != (BlockFilterIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_168,0x11b);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x11c;
  file_02.m_begin = (iterator)&local_178;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_188,
             msg_02);
  local_a8._0_1_ = (class_property<bool>)(pBVar4->m_filter_type == BASIC);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "filter_index->GetFilterType() == BlockFilterType::BASIC";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_190 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_198,0x11c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11f;
  file_03.m_begin = (iterator)&local_1a8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b8,
             msg_03);
  uStack_1d0 = 0;
  pcStack_1c0 = std::
                _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
              ::_M_manager;
  make_chain_00.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_00.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  make_chain_00.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  make_chain_00._M_invoker = (_Invoker_type)in_stack_fffffffffffffc70;
  local_1d8 = this;
  bVar2 = InitBlockFilterIndex(make_chain_00,(BlockFilterType)&local_1d8,0,false,true);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar2);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_258._8_8_ = "";
  assertion_descr = &local_80;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_1e0 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,assertion_descr,1,0,WARN,_cVar12,(size_t)&local_1e8,0x11f
            );
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  local_1ec = 0;
  uStack_210 = 0;
  pcStack_200 = std::
                _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
              ::_M_manager;
  fn.super__Function_base._M_functor._4_4_ = uVar8;
  fn.super__Function_base._M_functor._0_4_ = uVar7;
  fn.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  fn.super__Function_base._M_manager = in_stack_fffffffffffffc68;
  fn._M_invoker = in_stack_fffffffffffffc70;
  local_218 = &local_1ec;
  ForEachBlockFilterIndex(fn);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x123;
  file_04.m_begin = (iterator)&local_228;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_238,
             msg_04);
  local_258._8_8_ = local_258._8_8_ & 0xffffffffffffff00;
  local_258._0_8_ = &PTR__lazy_ostream_013abb30;
  local_248 = boost::unit_test::lazy_ostream::inst;
  local_240 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1ec == 1);
  local_b0 = &local_25c;
  local_25c = 1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013abcf0;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  p_Var11 = (_Invoker_type)0xf6d961;
  pcVar10 = "iter_count";
  BVar9 = BASIC;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_88 = &local_1ec;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_258,1,2,REQUIRE,0xe63b62,(size_t)&local_60,0x123,
             assertion_descr,"1",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x125;
  file_05.m_begin = (iterator)&local_270;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
             msg_05);
  rVar3.super_class_property<bool>.value = (class_property<bool>)DestroyBlockFilterIndex(BVar9);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_288 = "";
  BVar9 = BASIC;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  local_a8._0_1_ = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_290
             ,0x125);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x128;
  file_06.m_begin = (iterator)&local_2a0;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b0,
             msg_06);
  bVar2 = DestroyBlockFilterIndex(BVar9);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "!DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_2c0
             ,0x128);
  boost::detail::shared_count::~shared_count(&sStack_98);
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x12b;
  file_07.m_begin = (iterator)&local_2d0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
             msg_07);
  local_a8._0_1_ = (class_property<bool>)(pBVar4 == (BlockFilterIndex *)0x0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "filter_index == nullptr";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2e8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_258;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_2f0
             ,299);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x12e;
  file_08.m_begin = (iterator)&local_300;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_310,
             msg_08);
  uStack_330 = 0;
  pcStack_320 = std::
                _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
                ::_M_invoke;
  local_328 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
              ::_M_manager;
  make_chain_01.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_01.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_01.super__Function_base._M_functor._8_8_ = pcVar10;
  make_chain_01.super__Function_base._M_manager = (_Manager_type)assertion_descr;
  make_chain_01._M_invoker = p_Var11;
  local_338 = this;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain_01,(BlockFilterType)&local_338,0,false,true);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ =
       "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)local_258;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_340 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_348
             ,0x12e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_328 != (code *)0x0) {
    (*local_328)(&local_338,&local_338,3);
  }
  DestroyAllBlockFilterIndexes();
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x133;
  file_09.m_begin = (iterator)&local_358;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_368,
             msg_09);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,pBVar4 == (BlockFilterIndex *)0x0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_258._0_8_ = "filter_index == nullptr";
  local_258._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)local_258;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_370 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_378
             ,0x133);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockfilter_index_init_destroy, BasicTestingSetup)
{
    BlockFilterIndex* filter_index;

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index != nullptr);
    BOOST_CHECK(filter_index->GetFilterType() == BlockFilterType::BASIC);

    // Initialize returns false if index already exists.
    BOOST_CHECK(!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    int iter_count = 0;
    ForEachBlockFilterIndex([&iter_count](BlockFilterIndex& _index) { iter_count++; });
    BOOST_CHECK_EQUAL(iter_count, 1);

    BOOST_CHECK(DestroyBlockFilterIndex(BlockFilterType::BASIC));

    // Destroy returns false because index was already destroyed.
    BOOST_CHECK(!DestroyBlockFilterIndex(BlockFilterType::BASIC));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    // Reinitialize index.
    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    DestroyAllBlockFilterIndexes();

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);
}